

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O0

void anon_unknown.dwarf_23886::decrease_runners(void)

{
  int iVar1;
  uint uVar2;
  int local_c;
  int i;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 8));
  if (iVar1 != 0) {
    die("lock failed");
  }
  iVar1 = *(int *)((anonymous_namespace)::Shmem + 0x148c);
  uVar2 = llvm::cl::opt_storage::operator_cast_to_int
                    ((opt_storage *)((anonymous_namespace)::Cores + 0x80));
  if ((int)uVar2 < iVar1) {
    die("Shmem->Running <= Cores failed at line __LINE__");
    llvm::llvm_unreachable_internal
              ((llvm *)"assert",
               "/workspace/llm4binary/github/license_c_cmakelists/regehr[P]opt-fuzz/opt-fuzz.cpp",
               (char *)0xca,uVar2);
  }
  *(int *)((anonymous_namespace)::Shmem + 0x148c) =
       *(int *)((anonymous_namespace)::Shmem + 0x148c) + -1;
  local_c = 99;
  do {
    if (local_c < 0) {
LAB_0028169c:
      iVar1 = pthread_mutex_unlock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 8));
      if (iVar1 != 0) {
        die("unlock failed");
      }
      return;
    }
    if (*(int *)((anonymous_namespace)::Shmem + 0x12f8 + (long)local_c * 4) != 0) {
      *(int *)((anonymous_namespace)::Shmem + 0x12f8 + (long)local_c * 4) =
           *(int *)((anonymous_namespace)::Shmem + 0x12f8 + (long)local_c * 4) + -1;
      iVar1 = pthread_cond_signal((pthread_cond_t *)
                                  ((anonymous_namespace)::Shmem + 0x38 + (long)local_c * 0x30));
      if (iVar1 != 0) {
        die("pthread_cond_signal failed");
      }
      goto LAB_0028169c;
    }
    local_c = local_c + -1;
  } while( true );
}

Assistant:

void decrease_runners(void) {
  if (pthread_mutex_lock(&Shmem->Lock) != 0)
    die("lock failed");

  assert(Shmem->Running <= Cores);

  Shmem->Running--;
  // FIXME could cache the max depth, perhaps don't care
  for (int i = MAX_DEPTH - 1; i >= 0; --i) {
    if (Shmem->Waiting[i] != 0) {
      Shmem->Waiting[i]--;
      if (pthread_cond_signal(&Shmem->Cond[i]) != 0)
        die("pthread_cond_signal failed");
      break;
    }
  }

  if (pthread_mutex_unlock(&Shmem->Lock) != 0)
    die("unlock failed");
}